

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_enable_msi(int device_fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char irq_set_buf [24];
  char buf [512];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Enable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x30,
          "vfio_enable_msi");
  iVar1 = eventfd(0,0);
  iVar2 = ioctl(device_fd,0x3b6e);
  if (iVar2 != -1) {
    return iVar1;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  __xpg_strerror_r(iVar1,buf,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x40,
          "vfio_enable_msi","enable MSI interrupts",buf);
  exit(iVar1);
}

Assistant:

int vfio_enable_msi(int device_fd) {
	info("Enable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];
	int* fd_ptr;

	// setup event fd
	int event_fd = eventfd(0, 0);

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 1;
	irq_set->flags = VFIO_IRQ_SET_DATA_EVENTFD | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;
	fd_ptr = (int*) &irq_set->data;
	*fd_ptr = event_fd;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "enable MSI interrupts");

	return event_fd;
}